

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O3

void __thiscall Matrix2f::Matrix2f(Matrix2f *this,Vector2f *v0,Vector2f *v1,bool setColumns)

{
  undefined3 in_register_00000009;
  float fVar1;
  
  fVar1 = Vector2f::x(v0);
  this->m_elements[0] = fVar1;
  fVar1 = Vector2f::y(v0);
  this->m_elements[(ulong)!setColumns + 1] = fVar1;
  fVar1 = Vector2f::x(v1);
  this->m_elements[(ulong)CONCAT31(in_register_00000009,setColumns) + 1] = fVar1;
  fVar1 = Vector2f::y(v1);
  this->m_elements[3] = fVar1;
  return;
}

Assistant:

Matrix2f::Matrix2f( const Vector2f& v0, const Vector2f& v1, bool setColumns )
{
	if( setColumns )
	{
		setCol( 0, v0 );
		setCol( 1, v1 );
	}
	else
	{
		setRow( 0, v0 );
		setRow( 1, v1 );
	}
}